

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::AffineTransform::backward_impl
          (AffineTransform *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  pointer ppTVar4;
  float *pfVar5;
  Tensor *pTVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  Index index_1;
  ulong uVar24;
  Index index;
  long lVar25;
  ushort uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  int iVar46;
  int iVar47;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_98;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_78;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  ppTVar4 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_78 = xs;
  if ((ulong)((long)(xs->
                    super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4 >> 3) <= (ulong)i) {
    __assert_fail("i < xs.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                  ,0x625,
                  "virtual void cnn::AffineTransform::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if (i == 0) {
    if ((fx->d).bd != 1) {
      __assert_fail("fx.d.bd == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x62a,
                    "virtual void cnn::AffineTransform::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    uVar15 = (dEdxi->d).bd;
    local_b8.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value = (long)uVar15;
    if (((ulong)local_b8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value < 2) || ((dEdf->d).bd != 1)) {
      if (uVar15 != 0) {
        auVar34 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar15 = 0;
        do {
          uVar20 = (dEdf->d).nd;
          iVar47 = 1;
          iVar46 = 1;
          if ((ulong)uVar20 != 0) {
            auVar37 = vmovdqa64_avx512f(auVar34);
            auVar38 = vpbroadcastq_avx512f();
            uVar18 = 0;
            do {
              auVar39 = vpbroadcastq_avx512f();
              auVar31 = vmovdqa64_avx512f(auVar37);
              auVar37 = vporq_avx512f(auVar39,auVar35);
              auVar39 = vporq_avx512f(auVar39,auVar36);
              uVar10 = vpcmpuq_avx512f(auVar39,auVar38,2);
              bVar11 = (byte)uVar10;
              uVar10 = vpcmpuq_avx512f(auVar37,auVar38,2);
              bVar12 = (byte)uVar10;
              uVar26 = CONCAT11(bVar12,bVar11);
              auVar37 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar18));
              auVar39._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar37._4_4_;
              auVar39._0_4_ = (uint)(bVar11 & 1) * auVar37._0_4_;
              auVar39._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar37._8_4_;
              auVar39._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar37._12_4_;
              auVar39._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar37._16_4_;
              auVar39._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar37._20_4_;
              auVar39._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar37._24_4_;
              auVar39._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar37._28_4_;
              auVar39._32_4_ = (uint)(bVar12 & 1) * auVar37._32_4_;
              auVar39._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar37._36_4_;
              auVar39._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar37._40_4_;
              auVar39._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar37._44_4_;
              auVar39._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar37._48_4_;
              auVar39._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar37._52_4_;
              auVar39._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar37._56_4_;
              auVar39._60_4_ = (uint)(bVar12 >> 7) * auVar37._60_4_;
              uVar18 = uVar18 + 0x10;
              auVar37 = vpmulld_avx512f(auVar39,auVar31);
            } while (((ulong)uVar20 + 0xf & 0x1fffffff0) != uVar18);
            auVar37 = vmovdqa32_avx512f(auVar37);
            auVar38._0_4_ =
                 (uint)(bVar11 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar31._0_4_;
            bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar38._4_4_ = (uint)bVar7 * auVar37._4_4_ | (uint)!bVar7 * auVar31._4_4_;
            bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar38._8_4_ = (uint)bVar7 * auVar37._8_4_ | (uint)!bVar7 * auVar31._8_4_;
            bVar7 = (bool)((byte)(uVar26 >> 3) & 1);
            auVar38._12_4_ = (uint)bVar7 * auVar37._12_4_ | (uint)!bVar7 * auVar31._12_4_;
            bVar7 = (bool)((byte)(uVar26 >> 4) & 1);
            auVar38._16_4_ = (uint)bVar7 * auVar37._16_4_ | (uint)!bVar7 * auVar31._16_4_;
            bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
            auVar38._20_4_ = (uint)bVar7 * auVar37._20_4_ | (uint)!bVar7 * auVar31._20_4_;
            bVar7 = (bool)((byte)(uVar26 >> 6) & 1);
            auVar38._24_4_ = (uint)bVar7 * auVar37._24_4_ | (uint)!bVar7 * auVar31._24_4_;
            bVar7 = (bool)((byte)(uVar26 >> 7) & 1);
            auVar38._28_4_ = (uint)bVar7 * auVar37._28_4_ | (uint)!bVar7 * auVar31._28_4_;
            auVar38._32_4_ =
                 (uint)(bVar12 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar31._32_4_;
            bVar7 = (bool)(bVar12 >> 1 & 1);
            auVar38._36_4_ = (uint)bVar7 * auVar37._36_4_ | (uint)!bVar7 * auVar31._36_4_;
            bVar7 = (bool)(bVar12 >> 2 & 1);
            auVar38._40_4_ = (uint)bVar7 * auVar37._40_4_ | (uint)!bVar7 * auVar31._40_4_;
            bVar7 = (bool)(bVar12 >> 3 & 1);
            auVar38._44_4_ = (uint)bVar7 * auVar37._44_4_ | (uint)!bVar7 * auVar31._44_4_;
            bVar7 = (bool)(bVar12 >> 4 & 1);
            auVar38._48_4_ = (uint)bVar7 * auVar37._48_4_ | (uint)!bVar7 * auVar31._48_4_;
            bVar7 = (bool)(bVar12 >> 5 & 1);
            auVar38._52_4_ = (uint)bVar7 * auVar37._52_4_ | (uint)!bVar7 * auVar31._52_4_;
            bVar7 = (bool)(bVar12 >> 6 & 1);
            auVar38._56_4_ = (uint)bVar7 * auVar37._56_4_ | (uint)!bVar7 * auVar31._56_4_;
            auVar38._60_4_ =
                 (uint)(bVar12 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar31._60_4_;
            auVar27 = vextracti64x4_avx512f(auVar38,1);
            auVar37 = vpmulld_avx512f(auVar38,ZEXT3264(auVar27));
            auVar8 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
            auVar9 = vpshufd_avx(auVar8,0xee);
            auVar8 = vpmulld_avx(auVar8,auVar9);
            auVar9 = vpshufd_avx(auVar8,0x55);
            auVar8 = vpmulld_avx(auVar8,auVar9);
            iVar46 = auVar8._0_4_;
          }
          uVar19 = 1;
          if (1 < uVar20) {
            uVar19 = (dEdf->d).d[1];
          }
          pfVar5 = dEdf->v;
          uVar20 = (dEdf->d).d[0];
          uVar3 = (dEdxi->d).nd;
          if ((ulong)uVar3 != 0) {
            auVar37 = vmovdqa64_avx512f(auVar34);
            auVar38 = vpbroadcastq_avx512f();
            uVar18 = 0;
            do {
              auVar39 = vpbroadcastq_avx512f();
              auVar31 = vmovdqa64_avx512f(auVar37);
              auVar37 = vporq_avx512f(auVar39,auVar35);
              auVar39 = vporq_avx512f(auVar39,auVar36);
              uVar10 = vpcmpuq_avx512f(auVar39,auVar38,2);
              bVar11 = (byte)uVar10;
              uVar10 = vpcmpuq_avx512f(auVar37,auVar38,2);
              bVar12 = (byte)uVar10;
              uVar26 = CONCAT11(bVar12,bVar11);
              auVar37 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar18));
              auVar32._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar37._4_4_;
              auVar32._0_4_ = (uint)(bVar11 & 1) * auVar37._0_4_;
              auVar32._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar37._8_4_;
              auVar32._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar37._12_4_;
              auVar32._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar37._16_4_;
              auVar32._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar37._20_4_;
              auVar32._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar37._24_4_;
              auVar32._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar37._28_4_;
              auVar32._32_4_ = (uint)(bVar12 & 1) * auVar37._32_4_;
              auVar32._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar37._36_4_;
              auVar32._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar37._40_4_;
              auVar32._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar37._44_4_;
              auVar32._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar37._48_4_;
              auVar32._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar37._52_4_;
              auVar32._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar37._56_4_;
              auVar32._60_4_ = (uint)(bVar12 >> 7) * auVar37._60_4_;
              uVar18 = uVar18 + 0x10;
              auVar37 = vpmulld_avx512f(auVar32,auVar31);
            } while (((ulong)uVar3 + 0xf & 0x1fffffff0) != uVar18);
            auVar37 = vmovdqa32_avx512f(auVar37);
            auVar33._0_4_ =
                 (uint)(bVar11 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar31._0_4_;
            bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar33._4_4_ = (uint)bVar7 * auVar37._4_4_ | (uint)!bVar7 * auVar31._4_4_;
            bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar33._8_4_ = (uint)bVar7 * auVar37._8_4_ | (uint)!bVar7 * auVar31._8_4_;
            bVar7 = (bool)((byte)(uVar26 >> 3) & 1);
            auVar33._12_4_ = (uint)bVar7 * auVar37._12_4_ | (uint)!bVar7 * auVar31._12_4_;
            bVar7 = (bool)((byte)(uVar26 >> 4) & 1);
            auVar33._16_4_ = (uint)bVar7 * auVar37._16_4_ | (uint)!bVar7 * auVar31._16_4_;
            bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
            auVar33._20_4_ = (uint)bVar7 * auVar37._20_4_ | (uint)!bVar7 * auVar31._20_4_;
            bVar7 = (bool)((byte)(uVar26 >> 6) & 1);
            auVar33._24_4_ = (uint)bVar7 * auVar37._24_4_ | (uint)!bVar7 * auVar31._24_4_;
            bVar7 = (bool)((byte)(uVar26 >> 7) & 1);
            auVar33._28_4_ = (uint)bVar7 * auVar37._28_4_ | (uint)!bVar7 * auVar31._28_4_;
            auVar33._32_4_ =
                 (uint)(bVar12 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar31._32_4_;
            bVar7 = (bool)(bVar12 >> 1 & 1);
            auVar33._36_4_ = (uint)bVar7 * auVar37._36_4_ | (uint)!bVar7 * auVar31._36_4_;
            bVar7 = (bool)(bVar12 >> 2 & 1);
            auVar33._40_4_ = (uint)bVar7 * auVar37._40_4_ | (uint)!bVar7 * auVar31._40_4_;
            bVar7 = (bool)(bVar12 >> 3 & 1);
            auVar33._44_4_ = (uint)bVar7 * auVar37._44_4_ | (uint)!bVar7 * auVar31._44_4_;
            bVar7 = (bool)(bVar12 >> 4 & 1);
            auVar33._48_4_ = (uint)bVar7 * auVar37._48_4_ | (uint)!bVar7 * auVar31._48_4_;
            bVar7 = (bool)(bVar12 >> 5 & 1);
            auVar33._52_4_ = (uint)bVar7 * auVar37._52_4_ | (uint)!bVar7 * auVar31._52_4_;
            bVar7 = (bool)(bVar12 >> 6 & 1);
            auVar33._56_4_ = (uint)bVar7 * auVar37._56_4_ | (uint)!bVar7 * auVar31._56_4_;
            auVar33._60_4_ =
                 (uint)(bVar12 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar31._60_4_;
            auVar27 = vextracti64x4_avx512f(auVar33,1);
            auVar37 = vpmulld_avx512f(auVar33,ZEXT3264(auVar27));
            auVar8 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
            auVar9 = vpshufd_avx(auVar8,0xee);
            auVar8 = vpmulld_avx(auVar8,auVar9);
            auVar9 = vpshufd_avx(auVar8,0x55);
            auVar8 = vpmulld_avx(auVar8,auVar9);
            iVar47 = auVar8._0_4_;
          }
          uVar14 = 1;
          if (1 < uVar3) {
            uVar14 = (dEdxi->d).d[1];
          }
          if (((dEdxi->d).d[0] != uVar20) || (uVar14 != uVar19)) {
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                         );
          }
          pfVar1 = dEdxi->v +
                   (uint)((int)((ulong)uVar15 %
                               (ulong)local_b8.
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                      .
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                      .m_cols.m_value) * iVar47);
          uVar17 = (ulong)uVar19 * (ulong)uVar20;
          uVar18 = uVar17;
          if ((((ulong)pfVar1 & 3) == 0) &&
             (uVar18 = (ulong)(-((uint)((ulong)pfVar1 >> 2) & 0x3fffffff) & 0xf), uVar17 <= uVar18))
          {
            uVar18 = uVar17;
          }
          uVar20 = (uVar15 % (dEdf->d).bd) * iVar46;
          uVar21 = uVar17 - uVar18;
          uVar23 = uVar21 + 0xf;
          if (-1 < (long)uVar21) {
            uVar23 = uVar21;
          }
          if (uVar18 != 0) {
            lVar25 = 0;
            uVar24 = uVar18;
            do {
              pfVar1[lVar25] = pfVar1[lVar25] + pfVar5[(ulong)uVar20 + lVar25];
              lVar25 = lVar25 + 1;
              uVar24 = uVar24 - 1;
            } while (uVar24 != 0);
          }
          lVar25 = (uVar23 & 0xfffffffffffffff0) + uVar18;
          if (0xf < (long)uVar21) {
            do {
              auVar37 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar1 + uVar18),
                                       *(undefined1 (*) [64])(pfVar5 + uVar20 + uVar18));
              *(undefined1 (*) [64])(pfVar1 + uVar18) = auVar37;
              uVar18 = uVar18 + 0x10;
            } while ((long)uVar18 < lVar25);
          }
          if (lVar25 < (long)uVar17) {
            lVar22 = (long)uVar21 % 0x10;
            do {
              pfVar1[lVar25] = pfVar1[lVar25] + pfVar5[(ulong)uVar20 + lVar25];
              lVar25 = lVar25 + 1;
              lVar22 = lVar22 + -1;
            } while (lVar22 != 0);
          }
          uVar20 = (dEdxi->d).bd;
          local_b8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = (long)uVar20;
          uVar15 = uVar15 + 1;
        } while (uVar15 < uVar20);
      }
    }
    else {
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdf->v;
      uVar18 = (ulong)(dEdf->d).nd;
      if (uVar18 == 0) {
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = 1;
      }
      else {
        auVar34 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar37 = vpbroadcastq_avx512f();
        uVar18 = uVar18 + 0xf & 0xfffffffffffffff0;
        uVar17 = 0;
        do {
          auVar38 = vpbroadcastq_avx512f();
          auVar39 = vmovdqa64_avx512f(auVar34);
          auVar34 = vporq_avx512f(auVar38,auVar35);
          auVar38 = vporq_avx512f(auVar38,auVar36);
          uVar10 = vpcmpuq_avx512f(auVar38,auVar37,2);
          bVar11 = (byte)uVar10;
          uVar10 = vpcmpuq_avx512f(auVar34,auVar37,2);
          bVar12 = (byte)uVar10;
          uVar26 = CONCAT11(bVar12,bVar11);
          auVar34 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar17));
          auVar31._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar34._4_4_;
          auVar31._0_4_ = (uint)(bVar11 & 1) * auVar34._0_4_;
          auVar31._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar34._8_4_;
          auVar31._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar34._12_4_;
          auVar31._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar34._16_4_;
          auVar31._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar34._20_4_;
          auVar31._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar34._24_4_;
          auVar31._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar34._28_4_;
          auVar31._32_4_ = (uint)(bVar12 & 1) * auVar34._32_4_;
          auVar31._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar34._36_4_;
          auVar31._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar34._40_4_;
          auVar31._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar34._44_4_;
          auVar31._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar34._48_4_;
          auVar31._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar34._52_4_;
          auVar31._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar34._56_4_;
          auVar31._60_4_ = (uint)(bVar12 >> 7) * auVar34._60_4_;
          uVar17 = uVar17 + 0x10;
          auVar34 = vpmulld_avx512f(auVar31,auVar39);
        } while (uVar18 != uVar17);
        auVar34 = vmovdqa32_avx512f(auVar34);
        auVar35._0_4_ =
             (uint)(bVar11 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar39._0_4_;
        bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar7 * auVar34._4_4_ | (uint)!bVar7 * auVar39._4_4_;
        bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar7 * auVar34._8_4_ | (uint)!bVar7 * auVar39._8_4_;
        bVar7 = (bool)((byte)(uVar26 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar7 * auVar34._12_4_ | (uint)!bVar7 * auVar39._12_4_;
        bVar7 = (bool)((byte)(uVar26 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar7 * auVar34._16_4_ | (uint)!bVar7 * auVar39._16_4_;
        bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar7 * auVar34._20_4_ | (uint)!bVar7 * auVar39._20_4_;
        bVar7 = (bool)((byte)(uVar26 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar7 * auVar34._24_4_ | (uint)!bVar7 * auVar39._24_4_;
        bVar7 = (bool)((byte)(uVar26 >> 7) & 1);
        auVar35._28_4_ = (uint)bVar7 * auVar34._28_4_ | (uint)!bVar7 * auVar39._28_4_;
        auVar35._32_4_ =
             (uint)(bVar12 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar39._32_4_;
        bVar7 = (bool)(bVar12 >> 1 & 1);
        auVar35._36_4_ = (uint)bVar7 * auVar34._36_4_ | (uint)!bVar7 * auVar39._36_4_;
        bVar7 = (bool)(bVar12 >> 2 & 1);
        auVar35._40_4_ = (uint)bVar7 * auVar34._40_4_ | (uint)!bVar7 * auVar39._40_4_;
        bVar7 = (bool)(bVar12 >> 3 & 1);
        auVar35._44_4_ = (uint)bVar7 * auVar34._44_4_ | (uint)!bVar7 * auVar39._44_4_;
        bVar7 = (bool)(bVar12 >> 4 & 1);
        auVar35._48_4_ = (uint)bVar7 * auVar34._48_4_ | (uint)!bVar7 * auVar39._48_4_;
        bVar7 = (bool)(bVar12 >> 5 & 1);
        auVar35._52_4_ = (uint)bVar7 * auVar34._52_4_ | (uint)!bVar7 * auVar39._52_4_;
        bVar7 = (bool)(bVar12 >> 6 & 1);
        auVar35._56_4_ = (uint)bVar7 * auVar34._56_4_ | (uint)!bVar7 * auVar39._56_4_;
        auVar35._60_4_ =
             (uint)(bVar12 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar39._60_4_;
        auVar27 = vextracti64x4_avx512f(auVar35,1);
        auVar34 = vpmulld_avx512f(auVar35,ZEXT3264(auVar27));
        auVar8 = vpmulld_avx(auVar34._0_16_,auVar34._16_16_);
        auVar9 = vpshufd_avx(auVar8,0xee);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        auVar9 = vpshufd_avx(auVar8,0x55);
        auVar8 = vpmulld_avx(auVar8,auVar9);
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = CONCAT44((int)(uVar18 >> 0x20),auVar8._0_4_);
      }
      uVar15 = 1;
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdxi->v;
      if (1 < (dEdxi->d).nd) {
        uVar15 = (dEdxi->d).d[1];
      }
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)(uVar15 * (dEdxi->d).d[0]);
      Eigen::VectorwiseOp<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,0>::
      operator+=((VectorwiseOp<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,0>
                  *)&local_b8,
                 (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_70);
    }
  }
  else if ((i & 1) == 0) {
    uVar15 = (dEdf->d).bd;
    uVar20 = (ppTVar4[i - 1]->d).bd;
    if (uVar15 < uVar20) {
      uVar15 = uVar20;
    }
    if (uVar20 == 1) {
      Tensor::operator*(&local_70,ppTVar4[i - 1]);
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdf->v;
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)(dEdf->d).d[0];
      uVar15 = 1;
      if (1 < (dEdf->d).nd) {
        uVar15 = (dEdf->d).d[1];
      }
      uVar15 = uVar15 * (dEdf->d).bd;
      local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)uVar15;
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_70.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_70.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_70.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      if (local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value !=
          local_98.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value) {
LAB_001831d0:
        pcVar16 = 
        "Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Rhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Option = 0]"
        ;
LAB_001831e5:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar16);
      }
      local_50.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = dEdxi->v;
      local_50.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)(dEdxi->d).d[0];
      uVar20 = 1;
      if (1 < (dEdxi->d).nd) {
        uVar20 = (dEdxi->d).d[1];
      }
      uVar20 = uVar20 * (dEdxi->d).bd;
      local_50.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = (long)uVar20;
      if ((local_70.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value !=
           local_50.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value) || (uVar15 != uVar20)) {
LAB_001831f2:
        pcVar16 = 
        "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
        ;
LAB_00183207:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,pcVar16);
      }
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                (&local_50,
                 (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_b8,&local_98);
    }
    else if (0 < (int)uVar15) {
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar20 = 0;
      do {
        iVar46 = 1;
        pTVar6 = (local_78->
                 super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[i - 1];
        uVar19 = (pTVar6->d).nd;
        if ((ulong)uVar19 != 0) {
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar37 = vpbroadcastq_avx512f();
          uVar18 = 0;
          do {
            auVar38 = vpbroadcastq_avx512f();
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar36 = vporq_avx512f(auVar38,auVar34);
            auVar38 = vporq_avx512f(auVar38,auVar35);
            uVar10 = vpcmpuq_avx512f(auVar38,auVar37,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar36,auVar37,2);
            bVar12 = (byte)uVar10;
            uVar26 = CONCAT11(bVar12,bVar11);
            auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar6->d).d + uVar18));
            auVar40._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar36._4_4_;
            auVar40._0_4_ = (uint)(bVar11 & 1) * auVar36._0_4_;
            auVar40._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar36._8_4_;
            auVar40._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar36._12_4_;
            auVar40._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar36._16_4_;
            auVar40._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar36._20_4_;
            auVar40._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar36._24_4_;
            auVar40._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar36._28_4_;
            auVar40._32_4_ = (uint)(bVar12 & 1) * auVar36._32_4_;
            auVar40._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar36._36_4_;
            auVar40._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar36._40_4_;
            auVar40._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar36._44_4_;
            auVar40._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar36._48_4_;
            auVar40._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar36._52_4_;
            auVar40._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar36._56_4_;
            auVar40._60_4_ = (uint)(bVar12 >> 7) * auVar36._60_4_;
            uVar18 = uVar18 + 0x10;
            auVar36 = vpmulld_avx512f(auVar40,auVar39);
          } while (((ulong)uVar19 + 0xf & 0x1fffffff0) != uVar18);
          auVar36 = vmovdqa32_avx512f(auVar36);
          auVar41._0_4_ =
               (uint)(bVar11 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar39._0_4_;
          bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar41._4_4_ = (uint)bVar7 * auVar36._4_4_ | (uint)!bVar7 * auVar39._4_4_;
          bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar41._8_4_ = (uint)bVar7 * auVar36._8_4_ | (uint)!bVar7 * auVar39._8_4_;
          bVar7 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar41._12_4_ = (uint)bVar7 * auVar36._12_4_ | (uint)!bVar7 * auVar39._12_4_;
          bVar7 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar41._16_4_ = (uint)bVar7 * auVar36._16_4_ | (uint)!bVar7 * auVar39._16_4_;
          bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar41._20_4_ = (uint)bVar7 * auVar36._20_4_ | (uint)!bVar7 * auVar39._20_4_;
          bVar7 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar41._24_4_ = (uint)bVar7 * auVar36._24_4_ | (uint)!bVar7 * auVar39._24_4_;
          bVar7 = (bool)((byte)(uVar26 >> 7) & 1);
          auVar41._28_4_ = (uint)bVar7 * auVar36._28_4_ | (uint)!bVar7 * auVar39._28_4_;
          auVar41._32_4_ =
               (uint)(bVar12 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar39._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar41._36_4_ = (uint)bVar7 * auVar36._36_4_ | (uint)!bVar7 * auVar39._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar41._40_4_ = (uint)bVar7 * auVar36._40_4_ | (uint)!bVar7 * auVar39._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar41._44_4_ = (uint)bVar7 * auVar36._44_4_ | (uint)!bVar7 * auVar39._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar41._48_4_ = (uint)bVar7 * auVar36._48_4_ | (uint)!bVar7 * auVar39._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar41._52_4_ = (uint)bVar7 * auVar36._52_4_ | (uint)!bVar7 * auVar39._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar41._56_4_ = (uint)bVar7 * auVar36._56_4_ | (uint)!bVar7 * auVar39._56_4_;
          auVar41._60_4_ =
               (uint)(bVar12 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar39._60_4_;
          auVar27 = vextracti64x4_avx512f(auVar41,1);
          auVar36 = vpmulld_avx512f(auVar41,ZEXT3264(auVar27));
          auVar8 = vpmulld_avx(auVar36._0_16_,auVar36._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar46 = auVar8._0_4_;
        }
        uVar3 = (dEdf->d).nd;
        iVar47 = 1;
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(pTVar6->d).d[1];
        if (uVar19 < 2) {
          local_b8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        if ((ulong)uVar3 != 0) {
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar37 = vpbroadcastq_avx512f();
          uVar18 = 0;
          do {
            auVar38 = vpbroadcastq_avx512f();
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar36 = vporq_avx512f(auVar38,auVar34);
            auVar38 = vporq_avx512f(auVar38,auVar35);
            uVar10 = vpcmpuq_avx512f(auVar38,auVar37,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar36,auVar37,2);
            bVar12 = (byte)uVar10;
            uVar26 = CONCAT11(bVar12,bVar11);
            auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar18));
            auVar42._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar36._4_4_;
            auVar42._0_4_ = (uint)(bVar11 & 1) * auVar36._0_4_;
            auVar42._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar36._8_4_;
            auVar42._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar36._12_4_;
            auVar42._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar36._16_4_;
            auVar42._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar36._20_4_;
            auVar42._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar36._24_4_;
            auVar42._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar36._28_4_;
            auVar42._32_4_ = (uint)(bVar12 & 1) * auVar36._32_4_;
            auVar42._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar36._36_4_;
            auVar42._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar36._40_4_;
            auVar42._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar36._44_4_;
            auVar42._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar36._48_4_;
            auVar42._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar36._52_4_;
            auVar42._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar36._56_4_;
            auVar42._60_4_ = (uint)(bVar12 >> 7) * auVar36._60_4_;
            uVar18 = uVar18 + 0x10;
            auVar36 = vpmulld_avx512f(auVar42,auVar39);
          } while (((ulong)uVar3 + 0xf & 0x1fffffff0) != uVar18);
          auVar36 = vmovdqa32_avx512f(auVar36);
          auVar43._0_4_ =
               (uint)(bVar11 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar39._0_4_;
          bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar43._4_4_ = (uint)bVar7 * auVar36._4_4_ | (uint)!bVar7 * auVar39._4_4_;
          bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar43._8_4_ = (uint)bVar7 * auVar36._8_4_ | (uint)!bVar7 * auVar39._8_4_;
          bVar7 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar43._12_4_ = (uint)bVar7 * auVar36._12_4_ | (uint)!bVar7 * auVar39._12_4_;
          bVar7 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar43._16_4_ = (uint)bVar7 * auVar36._16_4_ | (uint)!bVar7 * auVar39._16_4_;
          bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar43._20_4_ = (uint)bVar7 * auVar36._20_4_ | (uint)!bVar7 * auVar39._20_4_;
          bVar7 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar43._24_4_ = (uint)bVar7 * auVar36._24_4_ | (uint)!bVar7 * auVar39._24_4_;
          bVar7 = (bool)((byte)(uVar26 >> 7) & 1);
          auVar43._28_4_ = (uint)bVar7 * auVar36._28_4_ | (uint)!bVar7 * auVar39._28_4_;
          auVar43._32_4_ =
               (uint)(bVar12 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar39._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar43._36_4_ = (uint)bVar7 * auVar36._36_4_ | (uint)!bVar7 * auVar39._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar43._40_4_ = (uint)bVar7 * auVar36._40_4_ | (uint)!bVar7 * auVar39._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar43._44_4_ = (uint)bVar7 * auVar36._44_4_ | (uint)!bVar7 * auVar39._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar43._48_4_ = (uint)bVar7 * auVar36._48_4_ | (uint)!bVar7 * auVar39._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar43._52_4_ = (uint)bVar7 * auVar36._52_4_ | (uint)!bVar7 * auVar39._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar43._56_4_ = (uint)bVar7 * auVar36._56_4_ | (uint)!bVar7 * auVar39._56_4_;
          auVar43._60_4_ =
               (uint)(bVar12 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar39._60_4_;
          auVar27 = vextracti64x4_avx512f(auVar43,1);
          auVar36 = vpmulld_avx512f(auVar43,ZEXT3264(auVar27));
          auVar8 = vpmulld_avx(auVar36._0_16_,auVar36._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar47 = auVar8._0_4_;
        }
        uVar19 = (pTVar6->d).d[0];
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar19;
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = pTVar6->v + (uVar20 % (pTVar6->d).bd) * iVar46;
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdf->v + (uVar20 % (dEdf->d).bd) * iVar47;
        uVar14 = (dEdf->d).d[0];
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar14;
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(dEdf->d).d[1];
        if (uVar3 < 2) {
          local_98.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        if (uVar19 != uVar14) goto LAB_001831d0;
        uVar19 = (dEdxi->d).nd;
        if ((ulong)uVar19 == 0) {
          iVar46 = 1;
        }
        else {
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar37 = vpbroadcastq_avx512f();
          uVar18 = 0;
          do {
            auVar38 = vpbroadcastq_avx512f();
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar36 = vporq_avx512f(auVar38,auVar34);
            auVar38 = vporq_avx512f(auVar38,auVar35);
            uVar10 = vpcmpuq_avx512f(auVar38,auVar37,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar36,auVar37,2);
            bVar12 = (byte)uVar10;
            uVar26 = CONCAT11(bVar12,bVar11);
            auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar18));
            auVar44._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar36._4_4_;
            auVar44._0_4_ = (uint)(bVar11 & 1) * auVar36._0_4_;
            auVar44._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar36._8_4_;
            auVar44._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar36._12_4_;
            auVar44._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar36._16_4_;
            auVar44._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar36._20_4_;
            auVar44._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar36._24_4_;
            auVar44._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar36._28_4_;
            auVar44._32_4_ = (uint)(bVar12 & 1) * auVar36._32_4_;
            auVar44._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar36._36_4_;
            auVar44._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar36._40_4_;
            auVar44._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar36._44_4_;
            auVar44._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar36._48_4_;
            auVar44._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar36._52_4_;
            auVar44._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar36._56_4_;
            auVar44._60_4_ = (uint)(bVar12 >> 7) * auVar36._60_4_;
            uVar18 = uVar18 + 0x10;
            auVar36 = vpmulld_avx512f(auVar44,auVar39);
          } while (((ulong)uVar19 + 0xf & 0x1fffffff0) != uVar18);
          auVar34 = vmovdqa32_avx512f(auVar36);
          auVar45._0_4_ =
               (uint)(bVar11 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar39._0_4_;
          bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar45._4_4_ = (uint)bVar7 * auVar34._4_4_ | (uint)!bVar7 * auVar39._4_4_;
          bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar45._8_4_ = (uint)bVar7 * auVar34._8_4_ | (uint)!bVar7 * auVar39._8_4_;
          bVar7 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar45._12_4_ = (uint)bVar7 * auVar34._12_4_ | (uint)!bVar7 * auVar39._12_4_;
          bVar7 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar45._16_4_ = (uint)bVar7 * auVar34._16_4_ | (uint)!bVar7 * auVar39._16_4_;
          bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar45._20_4_ = (uint)bVar7 * auVar34._20_4_ | (uint)!bVar7 * auVar39._20_4_;
          bVar7 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar45._24_4_ = (uint)bVar7 * auVar34._24_4_ | (uint)!bVar7 * auVar39._24_4_;
          bVar7 = (bool)((byte)(uVar26 >> 7) & 1);
          auVar45._28_4_ = (uint)bVar7 * auVar34._28_4_ | (uint)!bVar7 * auVar39._28_4_;
          auVar45._32_4_ =
               (uint)(bVar12 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar39._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar45._36_4_ = (uint)bVar7 * auVar34._36_4_ | (uint)!bVar7 * auVar39._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar45._40_4_ = (uint)bVar7 * auVar34._40_4_ | (uint)!bVar7 * auVar39._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar45._44_4_ = (uint)bVar7 * auVar34._44_4_ | (uint)!bVar7 * auVar39._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar45._48_4_ = (uint)bVar7 * auVar34._48_4_ | (uint)!bVar7 * auVar39._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar45._52_4_ = (uint)bVar7 * auVar34._52_4_ | (uint)!bVar7 * auVar39._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar45._56_4_ = (uint)bVar7 * auVar34._56_4_ | (uint)!bVar7 * auVar39._56_4_;
          auVar45._60_4_ =
               (uint)(bVar12 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar39._60_4_;
          auVar27 = vextracti64x4_avx512f(auVar45,1);
          auVar34 = vpmulld_avx512f(auVar45,ZEXT3264(auVar27));
          auVar8 = vpmulld_avx(auVar34._0_16_,auVar34._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar46 = auVar8._0_4_;
        }
        uVar3 = (dEdxi->d).d[0];
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar3;
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdxi->v + (uVar20 % (dEdxi->d).bd) * iVar46;
        uVar14 = (dEdxi->d).d[1];
        if (uVar19 < 2) {
          uVar14 = 1;
        }
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)uVar14;
        if ((uVar3 != (uint)local_b8.
                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                            .
                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                            .m_cols.m_value) ||
           ((uint)local_98.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_cols.m_value != uVar14)) goto LAB_001831f2;
        Eigen::internal::
        generic_product_impl<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
        ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                  (&local_70,
                   (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_b8,&local_98);
        auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar15);
    }
  }
  else {
    uVar15 = (dEdf->d).bd;
    uVar20 = (ppTVar4[i + 1]->d).bd;
    if (uVar20 < uVar15) {
      uVar20 = uVar15;
    }
    if (0 < (int)uVar20) {
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar15 = 0;
      do {
        uVar19 = (dEdf->d).nd;
        iVar46 = 1;
        if ((ulong)uVar19 != 0) {
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar37 = vpbroadcastq_avx512f();
          uVar18 = 0;
          do {
            auVar38 = vpbroadcastq_avx512f();
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar36 = vporq_avx512f(auVar38,auVar34);
            auVar38 = vporq_avx512f(auVar38,auVar35);
            uVar10 = vpcmpuq_avx512f(auVar38,auVar37,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar36,auVar37,2);
            bVar12 = (byte)uVar10;
            uVar26 = CONCAT11(bVar12,bVar11);
            auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar18));
            auVar36._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar38._4_4_;
            auVar36._0_4_ = (uint)(bVar11 & 1) * auVar38._0_4_;
            auVar36._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar38._8_4_;
            auVar36._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar38._12_4_;
            auVar36._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar38._16_4_;
            auVar36._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar38._20_4_;
            auVar36._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar38._24_4_;
            auVar36._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar38._28_4_;
            auVar36._32_4_ = (uint)(bVar12 & 1) * auVar38._32_4_;
            auVar36._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar38._36_4_;
            auVar36._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar38._40_4_;
            auVar36._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar38._44_4_;
            auVar36._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar38._48_4_;
            auVar36._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar38._52_4_;
            auVar36._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar38._56_4_;
            auVar36._60_4_ = (uint)(bVar12 >> 7) * auVar38._60_4_;
            uVar18 = uVar18 + 0x10;
            auVar36 = vpmulld_avx512f(auVar36,auVar39);
          } while (((ulong)uVar19 + 0xf & 0x1fffffff0) != uVar18);
          auVar36 = vmovdqa32_avx512f(auVar36);
          auVar37._0_4_ =
               (uint)(bVar11 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar39._0_4_;
          bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar37._4_4_ = (uint)bVar7 * auVar36._4_4_ | (uint)!bVar7 * auVar39._4_4_;
          bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar37._8_4_ = (uint)bVar7 * auVar36._8_4_ | (uint)!bVar7 * auVar39._8_4_;
          bVar7 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar37._12_4_ = (uint)bVar7 * auVar36._12_4_ | (uint)!bVar7 * auVar39._12_4_;
          bVar7 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar37._16_4_ = (uint)bVar7 * auVar36._16_4_ | (uint)!bVar7 * auVar39._16_4_;
          bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar37._20_4_ = (uint)bVar7 * auVar36._20_4_ | (uint)!bVar7 * auVar39._20_4_;
          bVar7 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar37._24_4_ = (uint)bVar7 * auVar36._24_4_ | (uint)!bVar7 * auVar39._24_4_;
          bVar7 = (bool)((byte)(uVar26 >> 7) & 1);
          auVar37._28_4_ = (uint)bVar7 * auVar36._28_4_ | (uint)!bVar7 * auVar39._28_4_;
          auVar37._32_4_ =
               (uint)(bVar12 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar39._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar37._36_4_ = (uint)bVar7 * auVar36._36_4_ | (uint)!bVar7 * auVar39._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar37._40_4_ = (uint)bVar7 * auVar36._40_4_ | (uint)!bVar7 * auVar39._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar37._44_4_ = (uint)bVar7 * auVar36._44_4_ | (uint)!bVar7 * auVar39._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar37._48_4_ = (uint)bVar7 * auVar36._48_4_ | (uint)!bVar7 * auVar39._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar37._52_4_ = (uint)bVar7 * auVar36._52_4_ | (uint)!bVar7 * auVar39._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar37._56_4_ = (uint)bVar7 * auVar36._56_4_ | (uint)!bVar7 * auVar39._56_4_;
          auVar37._60_4_ =
               (uint)(bVar12 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar39._60_4_;
          auVar27 = vextracti64x4_avx512f(auVar37,1);
          auVar36 = vpmulld_avx512f(auVar37,ZEXT3264(auVar27));
          auVar8 = vpmulld_avx(auVar36._0_16_,auVar36._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar46 = auVar8._0_4_;
        }
        iVar47 = 1;
        uVar3 = (dEdf->d).d[1];
        if (uVar19 < 2) {
          uVar3 = 1;
        }
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)uVar3;
        pTVar6 = (local_78->
                 super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[i + 1];
        uVar19 = (pTVar6->d).nd;
        if ((ulong)uVar19 != 0) {
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar37 = vpbroadcastq_avx512f();
          uVar18 = 0;
          do {
            auVar38 = vpbroadcastq_avx512f();
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar36 = vporq_avx512f(auVar38,auVar34);
            auVar38 = vporq_avx512f(auVar38,auVar35);
            uVar10 = vpcmpuq_avx512f(auVar38,auVar37,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar36,auVar37,2);
            bVar12 = (byte)uVar10;
            uVar26 = CONCAT11(bVar12,bVar11);
            auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar6->d).d + uVar18));
            auVar28._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar36._4_4_;
            auVar28._0_4_ = (uint)(bVar11 & 1) * auVar36._0_4_;
            auVar28._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar36._8_4_;
            auVar28._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar36._12_4_;
            auVar28._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar36._16_4_;
            auVar28._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar36._20_4_;
            auVar28._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar36._24_4_;
            auVar28._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar36._28_4_;
            auVar28._32_4_ = (uint)(bVar12 & 1) * auVar36._32_4_;
            auVar28._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar36._36_4_;
            auVar28._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar36._40_4_;
            auVar28._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar36._44_4_;
            auVar28._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar36._48_4_;
            auVar28._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar36._52_4_;
            auVar28._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar36._56_4_;
            auVar28._60_4_ = (uint)(bVar12 >> 7) * auVar36._60_4_;
            uVar18 = uVar18 + 0x10;
            auVar36 = vpmulld_avx512f(auVar28,auVar39);
          } while (((ulong)uVar19 + 0xf & 0x1fffffff0) != uVar18);
          auVar36 = vmovdqa32_avx512f(auVar36);
          auVar29._0_4_ =
               (uint)(bVar11 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar39._0_4_;
          bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar29._4_4_ = (uint)bVar7 * auVar36._4_4_ | (uint)!bVar7 * auVar39._4_4_;
          bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar29._8_4_ = (uint)bVar7 * auVar36._8_4_ | (uint)!bVar7 * auVar39._8_4_;
          bVar7 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar29._12_4_ = (uint)bVar7 * auVar36._12_4_ | (uint)!bVar7 * auVar39._12_4_;
          bVar7 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar29._16_4_ = (uint)bVar7 * auVar36._16_4_ | (uint)!bVar7 * auVar39._16_4_;
          bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar29._20_4_ = (uint)bVar7 * auVar36._20_4_ | (uint)!bVar7 * auVar39._20_4_;
          bVar7 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar29._24_4_ = (uint)bVar7 * auVar36._24_4_ | (uint)!bVar7 * auVar39._24_4_;
          bVar7 = (bool)((byte)(uVar26 >> 7) & 1);
          auVar29._28_4_ = (uint)bVar7 * auVar36._28_4_ | (uint)!bVar7 * auVar39._28_4_;
          auVar29._32_4_ =
               (uint)(bVar12 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar39._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar29._36_4_ = (uint)bVar7 * auVar36._36_4_ | (uint)!bVar7 * auVar39._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar29._40_4_ = (uint)bVar7 * auVar36._40_4_ | (uint)!bVar7 * auVar39._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar29._44_4_ = (uint)bVar7 * auVar36._44_4_ | (uint)!bVar7 * auVar39._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar29._48_4_ = (uint)bVar7 * auVar36._48_4_ | (uint)!bVar7 * auVar39._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar29._52_4_ = (uint)bVar7 * auVar36._52_4_ | (uint)!bVar7 * auVar39._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar29._56_4_ = (uint)bVar7 * auVar36._56_4_ | (uint)!bVar7 * auVar39._56_4_;
          auVar29._60_4_ =
               (uint)(bVar12 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar39._60_4_;
          auVar27 = vextracti64x4_avx512f(auVar29,1);
          auVar36 = vpmulld_avx512f(auVar29,ZEXT3264(auVar27));
          auVar8 = vpmulld_avx(auVar36._0_16_,auVar36._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar47 = auVar8._0_4_;
        }
        uVar14 = (dEdf->d).d[0];
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar14;
        local_b8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdf->v + (uVar15 % (dEdf->d).bd) * iVar46;
        uVar2 = (pTVar6->d).d[0];
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar2;
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = pTVar6->v + (uVar15 % (pTVar6->d).bd) * iVar47;
        local_98.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(pTVar6->d).d[1];
        if (uVar19 < 2) {
          local_98.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        if (uVar3 != (uint)local_98.
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_cols.m_value) {
          pcVar16 = 
          "Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Option = 0]"
          ;
          goto LAB_001831e5;
        }
        uVar19 = (dEdxi->d).nd;
        if ((ulong)uVar19 == 0) {
          iVar46 = 1;
        }
        else {
          auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
          auVar37 = vpbroadcastq_avx512f();
          uVar18 = 0;
          do {
            auVar38 = vpbroadcastq_avx512f();
            auVar39 = vmovdqa64_avx512f(auVar36);
            auVar36 = vporq_avx512f(auVar38,auVar34);
            auVar38 = vporq_avx512f(auVar38,auVar35);
            uVar10 = vpcmpuq_avx512f(auVar38,auVar37,2);
            bVar11 = (byte)uVar10;
            uVar10 = vpcmpuq_avx512f(auVar36,auVar37,2);
            bVar12 = (byte)uVar10;
            uVar26 = CONCAT11(bVar12,bVar11);
            auVar36 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar18));
            auVar30._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar36._4_4_;
            auVar30._0_4_ = (uint)(bVar11 & 1) * auVar36._0_4_;
            auVar30._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar36._8_4_;
            auVar30._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar36._12_4_;
            auVar30._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar36._16_4_;
            auVar30._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar36._20_4_;
            auVar30._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar36._24_4_;
            auVar30._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * auVar36._28_4_;
            auVar30._32_4_ = (uint)(bVar12 & 1) * auVar36._32_4_;
            auVar30._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar36._36_4_;
            auVar30._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar36._40_4_;
            auVar30._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar36._44_4_;
            auVar30._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar36._48_4_;
            auVar30._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar36._52_4_;
            auVar30._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar36._56_4_;
            auVar30._60_4_ = (uint)(bVar12 >> 7) * auVar36._60_4_;
            uVar18 = uVar18 + 0x10;
            auVar36 = vpmulld_avx512f(auVar30,auVar39);
          } while (((ulong)uVar19 + 0xf & 0x1fffffff0) != uVar18);
          auVar35 = vmovdqa32_avx512f(auVar36);
          auVar34._0_4_ =
               (uint)(bVar11 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar39._0_4_;
          bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
          auVar34._4_4_ = (uint)bVar7 * auVar35._4_4_ | (uint)!bVar7 * auVar39._4_4_;
          bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
          auVar34._8_4_ = (uint)bVar7 * auVar35._8_4_ | (uint)!bVar7 * auVar39._8_4_;
          bVar7 = (bool)((byte)(uVar26 >> 3) & 1);
          auVar34._12_4_ = (uint)bVar7 * auVar35._12_4_ | (uint)!bVar7 * auVar39._12_4_;
          bVar7 = (bool)((byte)(uVar26 >> 4) & 1);
          auVar34._16_4_ = (uint)bVar7 * auVar35._16_4_ | (uint)!bVar7 * auVar39._16_4_;
          bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
          auVar34._20_4_ = (uint)bVar7 * auVar35._20_4_ | (uint)!bVar7 * auVar39._20_4_;
          bVar7 = (bool)((byte)(uVar26 >> 6) & 1);
          auVar34._24_4_ = (uint)bVar7 * auVar35._24_4_ | (uint)!bVar7 * auVar39._24_4_;
          bVar7 = (bool)((byte)(uVar26 >> 7) & 1);
          auVar34._28_4_ = (uint)bVar7 * auVar35._28_4_ | (uint)!bVar7 * auVar39._28_4_;
          auVar34._32_4_ =
               (uint)(bVar12 & 1) * auVar35._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar39._32_4_;
          bVar7 = (bool)(bVar12 >> 1 & 1);
          auVar34._36_4_ = (uint)bVar7 * auVar35._36_4_ | (uint)!bVar7 * auVar39._36_4_;
          bVar7 = (bool)(bVar12 >> 2 & 1);
          auVar34._40_4_ = (uint)bVar7 * auVar35._40_4_ | (uint)!bVar7 * auVar39._40_4_;
          bVar7 = (bool)(bVar12 >> 3 & 1);
          auVar34._44_4_ = (uint)bVar7 * auVar35._44_4_ | (uint)!bVar7 * auVar39._44_4_;
          bVar7 = (bool)(bVar12 >> 4 & 1);
          auVar34._48_4_ = (uint)bVar7 * auVar35._48_4_ | (uint)!bVar7 * auVar39._48_4_;
          bVar7 = (bool)(bVar12 >> 5 & 1);
          auVar34._52_4_ = (uint)bVar7 * auVar35._52_4_ | (uint)!bVar7 * auVar39._52_4_;
          bVar7 = (bool)(bVar12 >> 6 & 1);
          auVar34._56_4_ = (uint)bVar7 * auVar35._56_4_ | (uint)!bVar7 * auVar39._56_4_;
          auVar34._60_4_ =
               (uint)(bVar12 >> 7) * auVar35._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar39._60_4_;
          auVar27 = vextracti64x4_avx512f(auVar34,1);
          auVar34 = vpmulld_avx512f(auVar34,ZEXT3264(auVar27));
          auVar8 = vpmulld_avx(auVar34._0_16_,auVar34._16_16_);
          auVar9 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          auVar9 = vpshufd_avx(auVar8,0x55);
          auVar8 = vpmulld_avx(auVar8,auVar9);
          iVar46 = auVar8._0_4_;
        }
        uVar3 = (dEdxi->d).d[0];
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)uVar3;
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = dEdxi->v + (uVar15 % (dEdxi->d).bd) * iVar46;
        uVar13 = (dEdxi->d).d[1];
        if (uVar19 < 2) {
          uVar13 = 1;
        }
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)uVar13;
        if ((uVar3 != uVar14) || (uVar2 != uVar13)) {
          pcVar16 = 
          "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Transpose<const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
          ;
          goto LAB_00183207;
        }
        Eigen::internal::
        generic_product_impl<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>,Eigen::DenseShape,Eigen::DenseShape,8>
        ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                  (&local_70,&local_b8,
                   (Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_98);
        auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar20);
    }
  }
  return;
}

Assistant:

void AffineTransform::backward_impl(const vector<const Tensor*>& xs,
                               const Tensor& fx,
                               const Tensor& dEdf,
                               unsigned i,
                               Tensor& dEdxi) const {
  assert(i < xs.size());
  if (i == 0) { // bias term
#if HAVE_CUDA
    CUBLAS_CHECK(cublasSaxpy(cublas_handle, dEdxi.d.size(), kSCALAR_ONE, dEdf.v, 1, dEdxi.v, 1));
#else
    assert(fx.d.bd == 1);
    // Add, using broadcasting or not
    if(dEdxi.d.bd > 1 && dEdf.d.bd == 1) {
      dEdxi.rowcol_matrix().colwise() += dEdf.vec();
    } else {
      for(unsigned b = 0; b < dEdxi.d.bd; ++b)
        dEdxi.batch_matrix(b) += dEdf.batch_matrix(b);
    }
#endif
  } else if (i % 2 == 1) { // left argument of matrix multiply
    int max_b = max(dEdf.d.bd, xs[i+1]->d.bd);
#if HAVE_CUDA
    for(int b = 0; b < max_b; ++b)
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_N, CUBLAS_OP_T,
            dEdxi.d.rows(), dEdxi.d.cols(), dEdf.d.cols(),
            kSCALAR_ONE,
            dEdf.batch_ptr(b), dEdf.d.rows(),
            xs[i+1]->batch_ptr(b), xs[i+1]->d.rows(),
            kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
#else
    for(int b = 0; b < max_b; ++b)
      dEdxi.batch_matrix(b).noalias() += dEdf.batch_matrix(b) * xs[i+1]->batch_matrix(b).transpose();
#endif
  } else {  // right argument of matrix multiply
    int max_b = max(xs[i-1]->d.bd, dEdf.d.bd);
#if HAVE_CUDA
    // TODO: Add reverse
    for(int b = 0; b < max_b; ++b)
      CUBLAS_CHECK(cublasSgemm(cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N,
            dEdxi.d.rows(), dEdxi.d.cols(), xs[i-1]->d.rows(),
            kSCALAR_ONE,
            xs[i-1]->batch_ptr(b), xs[i-1]->d.rows(),
            dEdf.batch_ptr(b), xs[i-1]->d.rows(),
            kSCALAR_ONE, dEdxi.batch_ptr(b), dEdxi.d.rows()));
#else
    if(xs[i-1]->d.bd == 1) {
      dEdxi.colbatch_matrix().noalias() += (**xs[i-1]).transpose() * dEdf.colbatch_matrix();
    } else {
      for(int b = 0; b < max_b; ++b)
        dEdxi.batch_matrix(b).noalias() += xs[i-1]->batch_matrix(b).transpose() * dEdf.batch_matrix(b);
    }
#endif
  }
}